

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O0

void noise_regular(void)

{
  int iVar1;
  ssize_t sVar2;
  undefined1 local_2a8 [8];
  rusage rusage;
  char buf [512];
  int ret;
  int fd;
  
  iVar1 = open("/proc/meminfo",0);
  if (-1 < iVar1) {
    while( true ) {
      sVar2 = read(iVar1,&rusage.field_15,0x200);
      if ((int)sVar2 < 1) break;
      random_add_noise(NOISE_SOURCE_MEMINFO,&rusage.field_15,(int)sVar2);
    }
    close(iVar1);
  }
  iVar1 = open("/proc/stat",0);
  if (-1 < iVar1) {
    while( true ) {
      sVar2 = read(iVar1,&rusage.field_15,0x200);
      if ((int)sVar2 < 1) break;
      random_add_noise(NOISE_SOURCE_STAT,&rusage.field_15,(int)sVar2);
    }
    close(iVar1);
  }
  getrusage(RUSAGE_SELF,(rusage *)local_2a8);
  random_add_noise(NOISE_SOURCE_RUSAGE,local_2a8,0x90);
  return;
}

Assistant:

void noise_regular(void)
{
    int fd;
    int ret;
    char buf[512];
    struct rusage rusage;

    if ((fd = open("/proc/meminfo", O_RDONLY)) >= 0) {
        while ( (ret = read(fd, buf, sizeof(buf))) > 0)
            random_add_noise(NOISE_SOURCE_MEMINFO, buf, ret);
        close(fd);
    }
    if ((fd = open("/proc/stat", O_RDONLY)) >= 0) {
        while ( (ret = read(fd, buf, sizeof(buf))) > 0)
            random_add_noise(NOISE_SOURCE_STAT, buf, ret);
        close(fd);
    }
    getrusage(RUSAGE_SELF, &rusage);
    random_add_noise(NOISE_SOURCE_RUSAGE, &rusage, sizeof(rusage));
}